

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

void __thiscall
Assimp::SIBImporter::InternReadFile
          (SIBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *this_00;
  pointer *this_01;
  aiMaterial **__dest;
  aiMesh **__dest_00;
  aiLight **__dest_01;
  value_type rOther;
  SIBObject *pSVar1;
  uint uVar2;
  IOStream *stream_00;
  DeadlyImportError *this_02;
  aiMaterial *this_03;
  size_type sVar3;
  reference __src;
  reference __src_00;
  reference ppaVar4;
  aiNode *paVar5;
  size_type sVar6;
  SIBObject *pSVar7;
  aiMetadata *paVar8;
  aiLight *paVar9;
  ulong uVar10;
  bool bVar11;
  uint *local_788;
  aiNode **local_760;
  aiLight **local_720;
  aiMesh **local_708;
  aiMaterial **local_6f0;
  aiNode *node_1;
  aiLight *light;
  size_t n_1;
  string local_660;
  uint local_640;
  bool local_639;
  uint i;
  uint *local_630;
  aiNode *local_628;
  aiNode *node;
  SIBObject *obj;
  size_t n;
  ulong local_608;
  aiNode **local_600;
  aiNode *local_5f8;
  aiNode *root;
  size_t childIdx;
  ulong local_5e0;
  aiLight **local_5d8;
  bool local_5c9;
  ulong local_5c8;
  aiMesh **local_5c0;
  bool local_5b1;
  ulong local_5b0;
  aiMaterial **local_5a8;
  SIBObject *local_5a0;
  SIBObject *local_598;
  __normal_iterator<SIBObject_*,_std::vector<SIBObject,_std::allocator<SIBObject>_>_> local_590;
  __normal_iterator<SIBObject_*,_std::vector<SIBObject,_std::allocator<SIBObject>_>_> local_588;
  const_iterator local_580;
  SIBObject *local_578;
  size_t firstInst;
  string local_568;
  undefined1 local_544 [8];
  aiString defname;
  aiMaterial *defmtl;
  SIB sib;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  StreamReaderLE stream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  SIBImporter *this_local;
  
  stream._48_8_ = pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"rb",&local_81);
  stream_00 = IOSystem::Open(pIOHandler,pFile,&local_80);
  StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_60,stream_00,false);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  uVar2 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)local_60);
  if (uVar2 < 0x10) {
    sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b8,"SIB file is either empty or corrupt: ",pFile);
    DeadlyImportError::DeadlyImportError(this_02,&local_b8);
    sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  SIB::SIB((SIB *)&defmtl);
  this_03 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_03);
  defname.data._1016_8_ = this_03;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"DefaultMaterial",(allocator<char> *)((long)&firstInst + 7));
  aiString::aiString((aiString *)local_544,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)((long)&firstInst + 7));
  aiMaterial::AddProperty((aiMaterial *)defname.data._1016_8_,(aiString *)local_544,"?mat.name",0,0)
  ;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&defmtl,
             (value_type *)(defname.data + 0x3f8));
  ReadScene((SIB *)&defmtl,(StreamReaderLE *)local_60);
  this_00 = &sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_578 = (SIBObject *)
              std::vector<SIBObject,_std::allocator<SIBObject>_>::size
                        ((vector<SIBObject,_std::allocator<SIBObject>_> *)this_00);
  local_588._M_current =
       (SIBObject *)
       std::vector<SIBObject,_std::allocator<SIBObject>_>::end
                 ((vector<SIBObject,_std::allocator<SIBObject>_> *)this_00);
  __gnu_cxx::__normal_iterator<SIBObject_const*,std::vector<SIBObject,std::allocator<SIBObject>>>::
  __normal_iterator<SIBObject*>
            ((__normal_iterator<SIBObject_const*,std::vector<SIBObject,std::allocator<SIBObject>>> *
             )&local_580,&local_588);
  this_01 = &sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_590._M_current =
       (SIBObject *)
       std::vector<SIBObject,_std::allocator<SIBObject>_>::begin
                 ((vector<SIBObject,_std::allocator<SIBObject>_> *)this_01);
  local_598 = (SIBObject *)
              std::vector<SIBObject,_std::allocator<SIBObject>_>::end
                        ((vector<SIBObject,_std::allocator<SIBObject>_> *)this_01);
  local_5a0 = (SIBObject *)
              std::vector<SIBObject,std::allocator<SIBObject>>::
              insert<__gnu_cxx::__normal_iterator<SIBObject*,std::vector<SIBObject,std::allocator<SIBObject>>>,void>
                        ((vector<SIBObject,std::allocator<SIBObject>> *)this_00,local_580,local_590,
                         (__normal_iterator<SIBObject_*,_std::vector<SIBObject,_std::allocator<SIBObject>_>_>
                          )local_598);
  std::vector<SIBObject,_std::allocator<SIBObject>_>::clear
            ((vector<SIBObject,_std::allocator<SIBObject>_> *)
             &sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                    ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&defmtl);
  pScene->mNumMaterials = (uint)sVar3;
  sVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                     &sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pScene->mNumMeshes = (uint)sVar3;
  sVar3 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                    ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)
                     &sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pScene->mNumLights = (uint)sVar3;
  local_5b1 = false;
  bVar11 = pScene->mNumMaterials == 0;
  if (bVar11) {
    local_6f0 = (aiMaterial **)0x0;
  }
  else {
    uVar10 = (ulong)pScene->mNumMaterials << 3;
    local_6f0 = (aiMaterial **)operator_new__(uVar10);
    local_5b0 = uVar10;
    local_5a8 = local_6f0;
  }
  local_5b1 = !bVar11;
  pScene->mMaterials = local_6f0;
  local_5c9 = false;
  bVar11 = pScene->mNumMeshes == 0;
  if (bVar11) {
    local_708 = (aiMesh **)0x0;
  }
  else {
    uVar10 = (ulong)pScene->mNumMeshes << 3;
    local_708 = (aiMesh **)operator_new__(uVar10);
    local_5c8 = uVar10;
    local_5c0 = local_708;
  }
  local_5c9 = !bVar11;
  pScene->mMeshes = local_708;
  childIdx._7_1_ = 0;
  bVar11 = pScene->mNumLights == 0;
  if (bVar11) {
    local_720 = (aiLight **)0x0;
  }
  else {
    uVar10 = (ulong)pScene->mNumLights << 3;
    local_720 = (aiLight **)operator_new__(uVar10);
    local_5e0 = uVar10;
    local_5d8 = local_720;
  }
  childIdx._7_1_ = !bVar11;
  pScene->mLights = local_720;
  if (pScene->mNumMaterials != 0) {
    __dest = pScene->mMaterials;
    __src = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                      ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&defmtl,0);
    memcpy(__dest,__src,(ulong)pScene->mNumMaterials << 3);
  }
  if (pScene->mNumMeshes != 0) {
    __dest_00 = pScene->mMeshes;
    __src_00 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                          &sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    memcpy(__dest_00,__src_00,(ulong)pScene->mNumMeshes << 3);
  }
  if (pScene->mNumLights != 0) {
    __dest_01 = pScene->mLights;
    ppaVar4 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::operator[]
                        ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)
                         &sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,0);
    memcpy(__dest_01,ppaVar4,(ulong)pScene->mNumLights << 3);
  }
  root = (aiNode *)0x0;
  paVar5 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar5);
  local_5f8 = paVar5;
  aiString::Set((aiString *)paVar5,"<SIBRoot>");
  sVar3 = std::vector<SIBObject,_std::allocator<SIBObject>_>::size
                    ((vector<SIBObject,_std::allocator<SIBObject>_> *)
                     &sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  sVar6 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                    ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)
                     &sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_5f8->mNumChildren = (int)sVar3 + (int)sVar6;
  n._7_1_ = 0;
  bVar11 = local_5f8->mNumChildren == 0;
  if (bVar11) {
    local_760 = (aiNode **)0x0;
  }
  else {
    uVar10 = (ulong)local_5f8->mNumChildren << 3;
    local_760 = (aiNode **)operator_new__(uVar10);
    local_608 = uVar10;
    local_600 = local_760;
  }
  n._7_1_ = !bVar11;
  local_5f8->mChildren = local_760;
  pScene->mRootNode = local_5f8;
  obj = (SIBObject *)0x0;
  while( true ) {
    pSVar1 = obj;
    pSVar7 = (SIBObject *)
             std::vector<SIBObject,_std::allocator<SIBObject>_>::size
                       ((vector<SIBObject,_std::allocator<SIBObject>_> *)
                        &sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pSVar7 <= pSVar1) {
      light = (aiLight *)0x0;
      while( true ) {
        paVar9 = (aiLight *)
                 std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                           ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)
                            &sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (paVar9 <= light) {
          SIB::~SIB((SIB *)&defmtl);
          StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_60);
          return;
        }
        if (local_5f8->mChildren == (aiNode **)0x0) break;
        ppaVar4 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::operator[]
                            ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)
                             &sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)light);
        rOther = *ppaVar4;
        if (rOther != (value_type)0x0) {
          paVar5 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar5);
          local_5f8->mChildren[(long)root] = paVar5;
          root = (aiNode *)((long)&(root->mName).length + 1);
          aiString::operator=((aiString *)paVar5,&rOther->mName);
          paVar5->mParent = local_5f8;
        }
        light = (aiLight *)((long)&(light->mName).length + 1);
      }
      __assert_fail("root->mChildren",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                    ,0x3a7,
                    "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                   );
    }
    if (local_5f8->mChildren == (aiNode **)0x0) break;
    node = (aiNode *)
           std::vector<SIBObject,_std::allocator<SIBObject>_>::operator[]
                     ((vector<SIBObject,_std::allocator<SIBObject>_> *)
                      &sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(size_type)obj);
    paVar5 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar5);
    local_5f8->mChildren[(long)root] = paVar5;
    local_628 = paVar5;
    root = (aiNode *)((long)&(root->mName).length + 1);
    aiString::operator=((aiString *)paVar5,&node->mName);
    local_628->mParent = local_5f8;
    memcpy(&local_628->mTransformation,&node->mTransformation,0x40);
    local_628->mNumMeshes = (uint)*(undefined8 *)&node->mNumChildren;
    local_639 = false;
    bVar11 = local_628->mNumMeshes == 0;
    if (bVar11) {
      local_788 = (uint *)0x0;
    }
    else {
      uVar10 = (ulong)local_628->mNumMeshes << 2;
      local_788 = (uint *)operator_new__(uVar10);
      _i = uVar10;
      local_630 = local_788;
    }
    local_639 = !bVar11;
    local_628->mMeshes = local_788;
    for (local_640 = 0; local_640 < local_628->mNumMeshes; local_640 = local_640 + 1) {
      local_628->mMeshes[local_640] = (int)node->mParent + local_640;
    }
    if (local_578 <= obj) {
      paVar8 = aiMetadata::Alloc(1);
      local_628->mMetaData = paVar8;
      paVar8 = local_628->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_660,"IsInstance",(allocator<char> *)((long)&n_1 + 7));
      n_1._6_1_ = 1;
      aiMetadata::Set<bool>(paVar8,0,&local_660,(bool *)((long)&n_1 + 6));
      std::__cxx11::string::~string((string *)&local_660);
      std::allocator<char>::~allocator((allocator<char> *)((long)&n_1 + 7));
    }
    obj = (SIBObject *)((long)&(obj->name).length + 1);
  }
  __assert_fail("root->mChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                ,0x38e,
                "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
               );
}

Assistant:

void SIBImporter::InternReadFile(const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile, "rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16)
        throw DeadlyImportError("SIB file is either empty or corrupt: " + pFile);

    SIB sib;

    // Default material.
    aiMaterial* defmtl = new aiMaterial;
    aiString defname = aiString(AI_DEFAULT_MATERIAL_NAME);
    defmtl->AddProperty(&defname, AI_MATKEY_NAME);
    sib.mtls.push_back(defmtl);

    // Read it all.
    ReadScene(&sib, &stream);

    // Join the instances and objects together.
    size_t firstInst = sib.objs.size();
    sib.objs.insert(sib.objs.end(), sib.insts.begin(), sib.insts.end());
    sib.insts.clear();

    // Transfer to the aiScene.
    pScene->mNumMaterials = static_cast<unsigned int>(sib.mtls.size());
    pScene->mNumMeshes = static_cast<unsigned int>(sib.meshes.size());
    pScene->mNumLights = static_cast<unsigned int>(sib.lights.size());
    pScene->mMaterials = pScene->mNumMaterials ? new aiMaterial*[pScene->mNumMaterials] : NULL;
    pScene->mMeshes = pScene->mNumMeshes ? new aiMesh*[pScene->mNumMeshes] : NULL;
    pScene->mLights = pScene->mNumLights ? new aiLight*[pScene->mNumLights] : NULL;
    if (pScene->mNumMaterials)
        memcpy(pScene->mMaterials, &sib.mtls[0], sizeof(aiMaterial*) * pScene->mNumMaterials);
    if (pScene->mNumMeshes)
        memcpy(pScene->mMeshes, &sib.meshes[0], sizeof(aiMesh*) * pScene->mNumMeshes);
    if (pScene->mNumLights)
        memcpy(pScene->mLights, &sib.lights[0], sizeof(aiLight*) * pScene->mNumLights);

    // Construct the root node.
    size_t childIdx = 0;
    aiNode *root = new aiNode();
    root->mName.Set("<SIBRoot>");
    root->mNumChildren = static_cast<unsigned int>(sib.objs.size() + sib.lights.size());
    root->mChildren = root->mNumChildren ? new aiNode*[root->mNumChildren] : NULL;
    pScene->mRootNode = root;

    // Add nodes for each object.
    for (size_t n=0;n<sib.objs.size();n++)
    {
        ai_assert(root->mChildren);
        SIBObject& obj = sib.objs[n];
        aiNode* node = new aiNode;
        root->mChildren[childIdx++] = node;
        node->mName = obj.name;
        node->mParent = root;
        node->mTransformation = obj.axis;

        node->mNumMeshes = static_cast<unsigned int>(obj.meshCount);
        node->mMeshes = node->mNumMeshes ? new unsigned[node->mNumMeshes] : NULL;
        for (unsigned i=0;i<node->mNumMeshes;i++)
            node->mMeshes[i] = static_cast<unsigned int>(obj.meshIdx + i);

        // Mark instanced objects as being so.
        if (n >= firstInst)
        {
            node->mMetaData = aiMetadata::Alloc( 1 );
            node->mMetaData->Set( 0, "IsInstance", true );
        }
    }

    // Add nodes for each light.
    // (no transformation as the light is already in world space)
    for (size_t n=0;n<sib.lights.size();n++)
    {
        ai_assert(root->mChildren);
        aiLight* light = sib.lights[n];
        if ( nullptr != light ) {
            aiNode* node = new aiNode;
            root->mChildren[ childIdx++ ] = node;
            node->mName = light->mName;
            node->mParent = root;
        }
    }
}